

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O0

void jsoncons::jsonpointer::
     add<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,char_const(&)[4]>
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *root,
               basic_json_pointer<char> *location,char (*value) [4],bool create_if_missing)

{
  bool bVar1;
  undefined8 uVar2;
  byte in_CL;
  error_code *in_RDX;
  jsonpointer_error *in_RSI;
  error_code ec;
  error_code *in_stack_00000140;
  bool in_stack_0000014f;
  char (*in_stack_00000150) [4];
  basic_json_pointer<char> *in_stack_00000158;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_00000160;
  error_code *in_stack_ffffffffffffffc0;
  error_code local_30;
  byte local_19;
  
  local_19 = in_CL & 1;
  std::error_code::error_code(in_stack_ffffffffffffffc0);
  add<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,char_const(&)[4]>
            (in_stack_00000160,in_stack_00000158,in_stack_00000150,in_stack_0000014f,
             in_stack_00000140);
  bVar1 = std::error_code::operator_cast_to_bool(&local_30);
  if (!bVar1) {
    return;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  jsonpointer_error::jsonpointer_error(in_RSI,in_RDX);
  __cxa_throw(uVar2,&jsonpointer_error::typeinfo,jsonpointer_error::~jsonpointer_error);
}

Assistant:

void add(Json& root, 
             const basic_json_pointer<typename Json::char_type>& location, 
             T&& value,
             bool create_if_missing = false)
    {
        std::error_code ec;
        add(root, location, std::forward<T>(value), create_if_missing, ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(jsonpointer_error(ec));
        }
    }